

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  bool bVar1;
  interval_t *in_RDI;
  RESULT_TYPE rval;
  RESULT_TYPE lval;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 in_stack_ffffffffffffffc8 [16];
  
  QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
  ::operator()(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
  ::operator()(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  if ((in_RDI[1].months & 1) == 0) {
    bVar1 = interval_t::operator<
                      (in_RDI,(interval_t *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  else {
    bVar1 = interval_t::operator<
                      (in_RDI,(interval_t *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  return bVar1;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}